

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leccalc.cpp
# Opt level: O1

void leccalc::loadoccurrence<occurrence>
               (map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                *event_to_periods,occurrence *occ,FILE *fin)

{
  iterator __position;
  size_t sVar1;
  vector<int,std::allocator<int>> *this;
  
  sVar1 = fread(occ,0xc,1,(FILE *)fin);
  if (sVar1 != 0) {
    do {
      this = (vector<int,std::allocator<int>> *)
             std::
             map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
             ::operator[](event_to_periods,&occ->event_id);
      __position._M_current = *(int **)(this + 8);
      if (__position._M_current == *(int **)(this + 0x10)) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (this,__position,&occ->period_no);
      }
      else {
        *__position._M_current = occ->period_no;
        *(int **)(this + 8) = __position._M_current + 1;
      }
      sVar1 = fread(occ,0xc,1,(FILE *)fin);
    } while (sVar1 != 0);
  }
  return;
}

Assistant:

void loadoccurrence(std::map<int, std::vector<int> >& event_to_periods,
			    T &occ, FILE * fin)
	{

		size_t i = fread(&occ, sizeof(occ), 1, fin);
		while (i != 0) {
			event_to_periods[occ.event_id].push_back(occ.period_no);
			i = fread(&occ, sizeof(occ), 1, fin);
		}
	}